

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_service_server(t_dart_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  pointer pptVar9;
  t_dart_generator *this_00;
  t_service *tservice_00;
  string class_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string extends_processor;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  vector<t_function_*,_std::allocator<t_function_*>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  char *local_1b0;
  long local_1a8;
  char local_1a0 [16];
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_1e8,&tservice->functions_)
  ;
  os = &this->f_service_;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"typedef void ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot);",
             0x4a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,endl2_abi_cxx11_._M_dataplus._M_p,endl2_abi_cxx11_._M_string_length);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
  if (tservice->extends_ != (t_service *)0x0) {
    get_ttype_class_name_abi_cxx11_(&local_248,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_248);
    paVar2 = &local_248.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    std::operator+(&local_228," extends ",&local_1d0);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_248.field_2._M_allocated_capacity = *psVar8;
      local_248.field_2._8_8_ = plVar7[3];
      local_248._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar8;
      local_248._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_248._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  pcVar3 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,
             pcVar3 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  std::__cxx11::string::append((char *)&local_248);
  this_00 = (t_dart_generator *)
            (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,this_00,
             (long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator +
             (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length);
  get_file_name(&local_50,this_00,&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_248._M_dataplus._M_p,
             local_248._M_dataplus._M_p + local_248._M_string_length);
  export_class_to_library(this,&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"class ",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_248._M_dataplus._M_p,local_248._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1b0,local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," implements TProcessor",0x16);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
  scope_up(this,(ostream *)os,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," iface)",7);
  if (local_1d0._M_string_length != 0) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": super(iface)",0xe);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
  scope_up(this,(ostream *)os,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_1d0._M_string_length == 0) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iface_ = iface;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar9 = local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"PROCESS_MAP[\"",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"] = ",5);
      pcVar3 = ((*pptVar9)->name_)._M_dataplus._M_p;
      local_208 = &local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,pcVar3,pcVar3 + ((*pptVar9)->name_)._M_string_length);
      paVar2 = local_208;
      iVar5 = tolower((int)local_208->_M_local_buf[0]);
      paVar2->_M_local_buf[0] = (char)iVar5;
      sVar4 = local_200;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      if (local_208 == &local_1f8) {
        local_228.field_2._8_8_ = local_1f8._8_8_;
      }
      else {
        local_228._M_dataplus._M_p = (pointer)local_208;
      }
      local_228.field_2._M_allocated_capacity._1_7_ = local_1f8._M_allocated_capacity._1_7_;
      local_228.field_2._M_local_buf[0] = local_1f8._M_local_buf[0];
      local_228._M_string_length = local_200;
      local_200 = 0;
      local_1f8._M_local_buf[0] = '\0';
      local_208 = &local_1f8;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_228._M_dataplus._M_p,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208);
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,(ostream *)os,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," iface_;",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_1d0._M_string_length == 0) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"final Map<String, ProcessFunction> PROCESS_MAP = {};",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"bool process(TProtocol iprot, TProtocol oprot)",0x2e);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110," ","");
  scope_up(this,(ostream *)os,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"TMessage msg = iprot.readMessageBegin();",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"ProcessFunction fn = PROCESS_MAP[msg.name];",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (fn == null)",0xf);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130," ","");
  scope_up(this,(ostream *)os,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"TProtocolUtil.skip(iprot, TType.STRUCT);",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readMessageEnd();",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "TApplicationError x = new TApplicationError(TApplicationErrorType.UNKNOWN_METHOD, \"Invalid method name: \'\"+msg.name+\"\'\");"
             ,0x79);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "oprot.writeMessageBegin(new TMessage(msg.name, TMessageType.EXCEPTION, msg.seqid));",
             0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x.write(oprot);",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.writeMessageEnd();",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot.transport.flush();",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  scope_down(this,(ostream *)os,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"fn(msg.seqid, iprot, oprot);",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  tservice_00 = (t_service *)os;
  scope_down(this,(ostream *)os,&local_170);
  pptVar9 = local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
    pptVar9 = local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  for (; pptVar9 !=
         local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
    generate_process_function(this,tservice_00,*pptVar9);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,endl2_abi_cxx11_._M_dataplus._M_p,
             endl2_abi_cxx11_._M_dataplus._M_p + endl2_abi_cxx11_._M_string_length);
  scope_down(this,(ostream *)os,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_dart_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  // typedef
  indent(f_service_) << "typedef void ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot);" << endl2;

  // Extends stuff
  string extends = "";
  string extends_processor = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_ttype_class_name(tservice->get_extends());
    extends_processor = " extends " + extends + "Processor";
  }

  // Generate the header portion
  string class_name =  service_name_ + "Processor";
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "class " << class_name << extends_processor << " implements TProcessor";
  scope_up(f_service_);

  indent(f_service_) << class_name << "(" << service_name_ << " iface)";
  if (!extends.empty()) {
    indent_up();
    f_service_ << endl;
    indent(f_service_) << ": super(iface)";
    indent_down();
  }
  scope_up(f_service_);

  if (extends.empty()) {
    indent(f_service_) << "iface_ = iface;" << endl;
  }

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_service_) << "PROCESS_MAP[\"" << (*f_iter)->get_name()
               << "\"] = " << get_member_name((*f_iter)->get_name()) << ";" << endl;
  }
  scope_down(f_service_, endl2);

  indent(f_service_) << service_name_ << " iface_;" << endl;

  if (extends.empty()) {
    indent(f_service_) << "final Map<String, ProcessFunction> PROCESS_MAP = {};" << endl;
  }

  f_service_ << endl;

  // Generate the server implementation
  indent(f_service_) << "bool process(TProtocol iprot, TProtocol oprot)";
  scope_up(f_service_);
  indent(f_service_) << "TMessage msg = iprot.readMessageBegin();" << endl;
  indent(f_service_) << "ProcessFunction fn = PROCESS_MAP[msg.name];" << endl;
  indent(f_service_) << "if (fn == null)";
  scope_up(f_service_);
  indent(f_service_) << "TProtocolUtil.skip(iprot, TType.STRUCT);" << endl;
  indent(f_service_) << "iprot.readMessageEnd();" << endl;
  indent(f_service_) << "TApplicationError x = new TApplicationError(TApplicationErrorType.UNKNOWN_METHOD, "
         "\"Invalid method name: '\"+msg.name+\"'\");" << endl;
  indent(f_service_) << "oprot.writeMessageBegin(new TMessage(msg.name, TMessageType.EXCEPTION, msg.seqid));" << endl;
  indent(f_service_) << "x.write(oprot);" << endl;
  indent(f_service_) << "oprot.writeMessageEnd();" << endl;
  indent(f_service_) << "oprot.transport.flush();" << endl;
  indent(f_service_) << "return true;" << endl;
  scope_down(f_service_);
  indent(f_service_) << "fn(msg.seqid, iprot, oprot);" << endl;
  indent(f_service_) << "return true;" << endl;
  scope_down(f_service_, endl2); // process function

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }

  scope_down(f_service_, endl2); // class
}